

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int bc_atom_to_idx(BCWriterState *s,uint32_t *pres,JSAtom atom)

{
  int *psize;
  uint uVar1;
  uint32_t *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = atom - s->first_atom;
  iVar4 = 0;
  if ((int)atom < 0 || atom < s->first_atom) goto LAB_0013e452;
  uVar1 = s->atom_to_idx_size;
  lVar5 = (long)(int)uVar1;
  iVar4 = 0;
  if (uVar6 < uVar1) {
    atom = s->atom_to_idx[uVar6];
    if (atom != 0) goto LAB_0013e452;
    if (uVar1 <= uVar6) goto LAB_0013e3e6;
  }
  else {
LAB_0013e3e6:
    psize = &s->atom_to_idx_size;
    bVar7 = true;
    if ((int)uVar1 < (int)(uVar6 + 1)) {
      iVar3 = js_realloc_array(s->ctx,&s->atom_to_idx,4,psize,uVar6 + 1);
      bVar7 = iVar3 == 0;
    }
    if (!bVar7) {
      return -1;
    }
    if ((int)uVar1 < *psize) {
      puVar2 = s->atom_to_idx;
      do {
        puVar2[lVar5] = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 < *psize);
    }
    if (!bVar7) {
      return -1;
    }
  }
  if ((s->idx_to_atom_count < s->idx_to_atom_size) ||
     (iVar3 = js_realloc_array(s->ctx,&s->idx_to_atom,4,&s->idx_to_atom_size,
                               s->idx_to_atom_count + 1), iVar3 == 0)) {
    uVar1 = s->idx_to_atom_count;
    s->idx_to_atom_count = uVar1 + 1;
    s->idx_to_atom[uVar1] = uVar6 + s->first_atom;
    atom = s->first_atom + uVar1;
    s->atom_to_idx[uVar6] = atom;
  }
  else {
    iVar4 = -1;
    atom = 0;
  }
LAB_0013e452:
  *pres = atom;
  return iVar4;
}

Assistant:

static int bc_atom_to_idx(BCWriterState *s, uint32_t *pres, JSAtom atom)
{
    uint32_t v;

    if (atom < s->first_atom || __JS_AtomIsTaggedInt(atom)) {
        *pres = atom;
        return 0;
    }
    atom -= s->first_atom;
    if (atom < s->atom_to_idx_size && s->atom_to_idx[atom] != 0) {
        *pres = s->atom_to_idx[atom];
        return 0;
    }
    if (atom >= s->atom_to_idx_size) {
        int old_size, i;
        old_size = s->atom_to_idx_size;
        if (js_resize_array(s->ctx, (void **)&s->atom_to_idx,
                            sizeof(s->atom_to_idx[0]), &s->atom_to_idx_size,
                            atom + 1))
            return -1;
        /* XXX: could add a specific js_resize_array() function to do it */
        for(i = old_size; i < s->atom_to_idx_size; i++)
            s->atom_to_idx[i] = 0;
    }
    if (js_resize_array(s->ctx, (void **)&s->idx_to_atom,
                        sizeof(s->idx_to_atom[0]),
                        &s->idx_to_atom_size, s->idx_to_atom_count + 1))
        goto fail;

    v = s->idx_to_atom_count++;
    s->idx_to_atom[v] = atom + s->first_atom;
    v += s->first_atom;
    s->atom_to_idx[atom] = v;
    *pres = v;
    return 0;
 fail:
    *pres = 0;
    return -1;
}